

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

void __thiscall
cmDocumentation::PrependSection(cmDocumentation *this,char *name,cmDocumentationEntry *docs)

{
  undefined1 local_38 [8];
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> docsVec;
  cmDocumentationEntry *docs_local;
  char *name_local;
  cmDocumentation *this_local;
  
  docsVec.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = docs;
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::vector
            ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_38);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
            ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_38,
             docsVec.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  PrependSection(this,name,
                 (vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_38);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
            ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_38);
  return;
}

Assistant:

void cmDocumentation::PrependSection(const char* name,
                                     cmDocumentationEntry& docs)
{

  std::vector<cmDocumentationEntry> docsVec;
  docsVec.push_back(docs);
  this->PrependSection(name, docsVec);
}